

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_remove_three_face_cell(REF_GRID ref_grid,REF_INT cell)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  REF_INT cell_00;
  int iVar3;
  REF_STATUS RVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  REF_INT found;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  REF_INT local_7c;
  undefined8 local_78;
  int local_70;
  int local_6c;
  REF_INT cell_nodes [4];
  REF_INT face;
  REF_INT cell_face_nodes [4];
  
  ref_cell = ref_grid->cell[8];
  lVar11 = 0;
  lVar10 = 0;
  local_a4 = -1;
  local_a0 = local_a4;
  local_9c = local_a4;
  local_98 = local_a4;
  local_94 = local_a4;
  local_8c = local_a4;
  local_88 = local_a4;
  local_84 = local_a4;
  local_80 = local_a4;
  local_7c = cell;
  do {
    if (lVar10 == 4) {
      uVar5 = 3;
      if ((local_9c != -1 && (local_a4 != -1 && local_a0 != -1)) &&
         (local_98 == local_94 && local_88 == local_98)) {
        uVar5 = ref_cell_remove(ref_grid->cell[3],local_a0);
        if (uVar5 == 0) {
          uVar5 = ref_cell_remove(ref_grid->cell[3],local_a4);
          if (uVar5 == 0) {
            uVar5 = ref_cell_remove(ref_grid->cell[3],local_9c);
            if (uVar5 == 0) {
              pRVar1 = ref_cell->f2n;
              pRVar2 = ref_cell->c2n;
              for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
                *(REF_INT *)((long)&local_78 + lVar10 * 4) =
                     pRVar2[(long)ref_cell->size_per * (long)cell +
                            (long)pRVar1[(local_8c + local_80 + local_84) * -4 + 0x18 + (int)lVar10]
                           ];
              }
              local_6c = local_94;
              local_78 = CONCAT44((int)local_78,(int)((ulong)local_78 >> 0x20));
              uVar5 = ref_cell_add(ref_grid->cell[3],(REF_INT *)&local_78,&face);
              cell_00 = local_7c;
              if (uVar5 == 0) {
                uVar5 = ref_cell_nodes(ref_cell,local_7c,cell_nodes);
                if (uVar5 == 0) {
                  iVar9 = (int)local_78;
                  iVar3 = local_78._4_4_;
                  uVar5 = ref_cell_remove(ref_cell,cell_00);
                  if (uVar5 == 0) {
                    uVar5 = ref_node_remove(ref_grid->node,
                                            (cell_nodes[2] + cell_nodes[3] +
                                            cell_nodes[1] + cell_nodes[0]) -
                                            (iVar9 + iVar3 + local_70));
                    if (uVar5 == 0) {
                      return 0;
                    }
                    pcVar8 = "remove node";
                    uVar7 = 0xb0;
                  }
                  else {
                    pcVar8 = "remove tet";
                    uVar7 = 0xad;
                  }
                }
                else {
                  pcVar8 = "tet";
                  uVar7 = 0xa7;
                }
              }
              else {
                pcVar8 = "add tri";
                uVar7 = 0xa5;
              }
            }
            else {
              pcVar8 = "remove tri1";
              uVar7 = 0x9a;
            }
          }
          else {
            pcVar8 = "remove tri1";
            uVar7 = 0x99;
          }
        }
        else {
          pcVar8 = "remove tri0";
          uVar7 = 0x98;
        }
LAB_001dbe6f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               uVar7,"ref_swap_remove_three_face_cell",(ulong)uVar5,pcVar8);
      }
      return uVar5;
    }
    pRVar1 = ref_cell->c2n;
    pRVar2 = ref_cell->f2n;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      cell_face_nodes[lVar6] =
           pRVar1[(long)ref_cell->size_per * (long)cell +
                  (long)*(int *)((long)pRVar2 + lVar6 * 4 + lVar11)];
    }
    RVar4 = ref_cell_with(ref_grid->cell[3],cell_face_nodes,&found);
    if (RVar4 == 0) {
      uVar5 = ref_cell_nodes(ref_grid->cell[3],found,(REF_INT *)&local_78);
      if (uVar5 != 0) {
        pcVar8 = "tri";
        uVar7 = 0x7f;
        goto LAB_001dbe6f;
      }
      iVar9 = (int)lVar10;
      cell = local_7c;
      if (local_a0 == -1) {
        local_a0 = found;
        local_98 = local_6c;
        local_84 = iVar9;
      }
      else if (local_a4 == -1) {
        local_a4 = found;
        local_88 = local_6c;
        local_8c = iVar9;
      }
      else {
        if (local_9c != -1) {
          pcVar8 = "four faces detected";
          uVar5 = 3;
          uVar7 = 0x8a;
          goto LAB_001dbe6f;
        }
        local_9c = found;
        local_94 = local_6c;
        local_80 = iVar9;
      }
    }
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 0x10;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_swap_remove_three_face_cell(REF_GRID ref_grid,
                                                   REF_INT cell) {
  REF_CELL ref_cell;
  REF_INT cell_face;
  REF_INT node;
  REF_INT cell_nodes[4];
  REF_INT cell_face_nodes[4];
  REF_INT face_nodes[4];
  REF_INT found;
  REF_INT face0, face1, face2;
  REF_INT cell_face0, cell_face1, cell_face2;
  REF_INT faceid0, faceid1, faceid2;
  REF_INT temp, face;
  REF_INT remove_this_node;

  ref_cell = ref_grid_tet(ref_grid);

  face0 = REF_EMPTY;
  face1 = REF_EMPTY;
  face2 = REF_EMPTY;
  faceid0 = REF_EMPTY;
  faceid1 = REF_EMPTY;
  faceid2 = REF_EMPTY;
  cell_face0 = REF_EMPTY;
  cell_face1 = REF_EMPTY;
  cell_face2 = REF_EMPTY;
  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (REF_SUCCESS ==
        ref_cell_with(ref_grid_tri(ref_grid), cell_face_nodes, &found)) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), found, face_nodes), "tri");
      if (REF_EMPTY == face0) {
        face0 = found;
        faceid0 = face_nodes[3];
        cell_face0 = cell_face;
      } else if (REF_EMPTY == face1) {
        face1 = found;
        faceid1 = face_nodes[3];
        cell_face1 = cell_face;
      } else {
        if (REF_EMPTY != face2) {
          RSS(REF_INVALID, "four faces detected");
        }
        face2 = found;
        faceid2 = face_nodes[3];
        cell_face2 = cell_face;
      }
    }
  }

  if (REF_EMPTY == face0) return REF_INVALID;
  if (REF_EMPTY == face1) return REF_INVALID;
  if (REF_EMPTY == face2) return REF_INVALID;
  if (faceid0 != faceid1 || faceid0 != faceid2) return REF_INVALID;

  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face0), "remove tri0");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face1), "remove tri1");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face2), "remove tri1");

  cell_face = 0 + 1 + 2 + 3 - cell_face0 - cell_face1 - cell_face2;

  for (node = 0; node < 4; node++)
    face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);

  face_nodes[3] = faceid0;
  temp = face_nodes[0];
  face_nodes[0] = face_nodes[1];
  face_nodes[1] = temp;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), face_nodes, &face), "add tri");

  RSS(ref_cell_nodes(ref_cell, cell, cell_nodes), "tet");

  remove_this_node = cell_nodes[0] + cell_nodes[1] + cell_nodes[2] +
                     cell_nodes[3] - face_nodes[0] - face_nodes[1] -
                     face_nodes[2];

  RSS(ref_cell_remove(ref_cell, cell), "remove tet");

  RSS(ref_node_remove(ref_grid_node(ref_grid), remove_this_node),
      "remove node");

  return REF_SUCCESS;
}